

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonOom(JsonString *p)

{
  p->bErr = '\x01';
  sqlite3_result_error_nomem(p->pCtx);
  if (p->bStatic == '\0') {
    sqlite3_free(p->zBuf);
  }
  p->zBuf = p->zSpace;
  p->nAlloc = 100;
  p->nUsed = 0;
  p->bStatic = '\x01';
  return;
}

Assistant:

static void jsonOom(JsonString *p){
  p->bErr = 1;
  sqlite3_result_error_nomem(p->pCtx);
  jsonReset(p);
}